

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void SkipExpectedString(FILE *in,char *str)

{
  uint uVar1;
  char *pcStack_18;
  int c;
  char *str_local;
  FILE *in_local;
  
  pcStack_18 = str;
  while( true ) {
    if (*pcStack_18 == '\0') {
      return;
    }
    uVar1 = getc((FILE *)in);
    if (uVar1 != (int)*pcStack_18) break;
    pcStack_18 = pcStack_18 + 1;
  }
  fprintf(_stderr,"unexpected character \'%c\'\n",(ulong)uVar1);
  exit(1);
}

Assistant:

static void
SkipExpectedString(FILE* in, char* str)
{
    int c;
    while (*str != '\0') {
        c = getc(in);
        if (c != *str) {
            fprintf(stderr, "unexpected character '%c'\n", c);
            exit(1);
        }
        str++;
    }
}